

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManDupHalfSeq(Gia_Man_t *p,int fSecond)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  Gia_Man_t *p_00;
  size_t sVar5;
  char *pcVar6;
  Gia_Obj_t *pGVar7;
  Vec_Int_t *pVVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar2);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pcVar2);
  }
  p_00->pName = pcVar6;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar2);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pcVar2);
  }
  p_00->pSpec = pcVar6;
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  if (fSecond == 0) {
    pVVar8 = p->vCis;
    uVar10 = (ulong)(uint)pVVar8->nSize;
    if (p->nRegs < pVVar8->nSize) {
      lVar12 = 0;
      do {
        if ((int)uVar10 <= lVar12) goto LAB_001f6b75;
        iVar13 = pVVar8->pArray[lVar12];
        if (((long)iVar13 < 0) || (p->nObjs <= iVar13)) goto LAB_001f6b37;
        pGVar3 = p->pObjs;
        if (pGVar3 == (Gia_Obj_t *)0x0) break;
        pGVar7 = Gia_ManAppendObj(p_00);
        uVar10 = *(ulong *)pGVar7;
        *(ulong *)pGVar7 = uVar10 | 0x9fffffff;
        *(ulong *)pGVar7 =
             uVar10 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar4 = p_00->pObjs;
        if ((pGVar7 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar7)) goto LAB_001f6b56;
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar4) >> 2) * -0x55555555);
        pGVar4 = p_00->pObjs;
        if ((pGVar7 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar7)) goto LAB_001f6b56;
        pGVar3[iVar13].Value = (int)((ulong)((long)pGVar7 - (long)pGVar4) >> 2) * 0x55555556;
        lVar12 = lVar12 + 1;
        pVVar8 = p->vCis;
        uVar10 = (ulong)pVVar8->nSize;
      } while (lVar12 < (long)(uVar10 - (long)p->nRegs));
    }
    iVar13 = p->nRegs;
    if (0 < iVar13) {
      iVar11 = 0;
      do {
        iVar1 = p->vCis->nSize;
        uVar9 = (iVar1 - iVar13) + iVar11;
        if (((int)uVar9 < 0) || (iVar1 <= (int)uVar9)) goto LAB_001f6b75;
        iVar1 = p->vCis->pArray[uVar9];
        if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_001f6b37;
        pGVar3 = p->pObjs;
        if (pGVar3 == (Gia_Obj_t *)0x0) break;
        if (iVar13 / 2 <= iVar11) {
          pGVar7 = Gia_ManAppendObj(p_00);
          uVar10 = *(ulong *)pGVar7;
          *(ulong *)pGVar7 = uVar10 | 0x9fffffff;
          *(ulong *)pGVar7 =
               uVar10 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar4 = p_00->pObjs;
          if ((pGVar7 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar7)) goto LAB_001f6b56;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar4) >> 2) * -0x55555555);
          pGVar4 = p_00->pObjs;
          if ((pGVar7 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar7)) goto LAB_001f6b56;
          pGVar3[iVar1].Value = (int)((ulong)((long)pGVar7 - (long)pGVar4) >> 2) * 0x55555556;
        }
        iVar11 = iVar11 + 1;
        iVar13 = p->nRegs;
      } while (iVar11 < iVar13);
    }
    iVar13 = p->nRegs;
    if (0 < iVar13) {
      iVar11 = 0;
      do {
        iVar1 = p->vCis->nSize;
        uVar9 = (iVar1 - iVar13) + iVar11;
        if (((int)uVar9 < 0) || (iVar1 <= (int)uVar9)) goto LAB_001f6b75;
        iVar1 = p->vCis->pArray[uVar9];
        if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_001f6b37;
        pGVar3 = p->pObjs;
        if (pGVar3 == (Gia_Obj_t *)0x0) break;
        if (iVar11 < iVar13 / 2) {
          pGVar7 = Gia_ManAppendObj(p_00);
          uVar10 = *(ulong *)pGVar7;
          *(ulong *)pGVar7 = uVar10 | 0x9fffffff;
          *(ulong *)pGVar7 =
               uVar10 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar4 = p_00->pObjs;
          if ((pGVar7 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar7)) goto LAB_001f6b56;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar4) >> 2) * -0x55555555);
          pGVar4 = p_00->pObjs;
          if ((pGVar7 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar7)) goto LAB_001f6b56;
          pGVar3[iVar1].Value = (int)((ulong)((long)pGVar7 - (long)pGVar4) >> 2) * 0x55555556;
        }
        iVar11 = iVar11 + 1;
        iVar13 = p->nRegs;
      } while (iVar11 < iVar13);
    }
    pVVar8 = p->vCos;
    uVar10 = (ulong)(uint)pVVar8->nSize;
    if (p->nRegs < pVVar8->nSize) {
      lVar12 = 0;
      do {
        if ((int)uVar10 <= lVar12) goto LAB_001f6b75;
        iVar13 = pVVar8->pArray[lVar12];
        if (((long)iVar13 < 0) || (p->nObjs <= iVar13)) goto LAB_001f6b37;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        Gia_ManDupOrderDfs_rec(p_00,p,p->pObjs + iVar13);
        lVar12 = lVar12 + 1;
        pVVar8 = p->vCos;
        uVar10 = (ulong)pVVar8->nSize;
      } while (lVar12 < (long)(uVar10 - (long)p->nRegs));
    }
    iVar13 = p->nRegs;
    if (0 < iVar13) {
      iVar11 = 0;
      do {
        iVar1 = p->vCos->nSize;
        uVar9 = (iVar1 - iVar13) + iVar11;
        if (((int)uVar9 < 0) || (iVar1 <= (int)uVar9)) goto LAB_001f6b75;
        iVar1 = p->vCos->pArray[uVar9];
        if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_001f6b37;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        if (iVar11 < iVar13 / 2) {
          Gia_ManDupOrderDfs_rec(p_00,p,p->pObjs + iVar1);
        }
        iVar11 = iVar11 + 1;
        iVar13 = p->nRegs;
      } while (iVar11 < iVar13);
    }
    iVar13 = iVar13 / 2;
  }
  else {
    pVVar8 = p->vCis;
    if (0 < pVVar8->nSize) {
      lVar12 = 0;
      do {
        iVar13 = pVVar8->pArray[lVar12];
        if (((long)iVar13 < 0) || (p->nObjs <= iVar13)) goto LAB_001f6b37;
        pGVar3 = p->pObjs;
        if (pGVar3 == (Gia_Obj_t *)0x0) break;
        pGVar7 = Gia_ManAppendObj(p_00);
        uVar10 = *(ulong *)pGVar7;
        *(ulong *)pGVar7 = uVar10 | 0x9fffffff;
        *(ulong *)pGVar7 =
             uVar10 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar4 = p_00->pObjs;
        if ((pGVar7 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar7)) {
LAB_001f6b56:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar4) >> 2) * -0x55555555);
        pGVar4 = p_00->pObjs;
        if ((pGVar7 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar7)) goto LAB_001f6b56;
        pGVar3[iVar13].Value = (int)((ulong)((long)pGVar7 - (long)pGVar4) >> 2) * 0x55555556;
        lVar12 = lVar12 + 1;
        pVVar8 = p->vCis;
      } while (lVar12 < pVVar8->nSize);
    }
    pVVar8 = p->vCos;
    uVar10 = (ulong)(uint)pVVar8->nSize;
    if (p->nRegs < pVVar8->nSize) {
      lVar12 = 0;
      do {
        if ((int)uVar10 <= lVar12) goto LAB_001f6b75;
        iVar13 = pVVar8->pArray[lVar12];
        if (((long)iVar13 < 0) || (p->nObjs <= iVar13)) goto LAB_001f6b37;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        Gia_ManDupOrderDfs_rec(p_00,p,p->pObjs + iVar13);
        lVar12 = lVar12 + 1;
        pVVar8 = p->vCos;
        uVar10 = (ulong)pVVar8->nSize;
      } while (lVar12 < (long)(uVar10 - (long)p->nRegs));
    }
    iVar13 = p->nRegs;
    if (0 < iVar13) {
      iVar11 = 0;
      do {
        iVar1 = p->vCos->nSize;
        uVar9 = (iVar1 - iVar13) + iVar11;
        if (((int)uVar9 < 0) || (iVar1 <= (int)uVar9)) {
LAB_001f6b75:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar1 = p->vCos->pArray[uVar9];
        if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_001f6b37:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        if (iVar13 / 2 <= iVar11) {
          Gia_ManDupOrderDfs_rec(p_00,p,p->pObjs + iVar1);
        }
        iVar11 = iVar11 + 1;
        iVar13 = p->nRegs;
      } while (iVar11 < iVar13);
    }
    iVar13 = iVar13 - iVar13 / 2;
  }
  Gia_ManSetRegNum(p_00,iVar13);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupHalfSeq( Gia_Man_t * p, int fSecond )
{
    int i; Gia_Obj_t * pObj;
    Gia_Man_t * pNew = Gia_ManStart( Gia_ManObjNum(p) ); 
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue(p);
    Gia_ManConst0(p)->Value = 0;
    if ( fSecond )
    {
        Gia_ManForEachCi( p, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
        Gia_ManForEachPo( p, pObj, i )
            Gia_ManDupOrderDfs_rec( pNew, p, pObj );
        Gia_ManForEachRi( p, pObj, i )
            if ( i >= Gia_ManRegNum(p)/2 )
                Gia_ManDupOrderDfs_rec( pNew, p, pObj );
        Gia_ManSetRegNum( pNew, Gia_ManRegNum(p)- Gia_ManRegNum(p)/2 );
    }
    else
    {
        Gia_ManForEachPi( p, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
        Gia_ManForEachRo( p, pObj, i )
            if ( i >= Gia_ManRegNum(p)/2 )
                pObj->Value = Gia_ManAppendCi( pNew );
        Gia_ManForEachRo( p, pObj, i )
            if ( i < Gia_ManRegNum(p)/2 )
                pObj->Value = Gia_ManAppendCi( pNew );
        Gia_ManForEachPo( p, pObj, i )
            Gia_ManDupOrderDfs_rec( pNew, p, pObj );
        Gia_ManForEachRi( p, pObj, i )
            if ( i < Gia_ManRegNum(p)/2 )
                Gia_ManDupOrderDfs_rec( pNew, p, pObj );
        Gia_ManSetRegNum( pNew, Gia_ManRegNum(p)/2 );
    }
    return pNew;
}